

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForVisibilityNotify(_GLFWwindow *window)

{
  int iVar1;
  GLFWbool GVar2;
  long in_RDI;
  double timeout;
  XEvent dummy;
  double *timeout_00;
  undefined1 local_d0 [192];
  long local_10;
  
  timeout_00 = (double *)0x3fb999999999999a;
  local_10 = in_RDI;
  do {
    iVar1 = XCheckTypedWindowEvent(_glfw.x11.display,*(undefined8 *)(local_10 + 0x350),0xf,local_d0)
    ;
    if (iVar1 != 0) {
      return 1;
    }
    GVar2 = waitForX11Event(timeout_00);
  } while (GVar2 != 0);
  return 0;
}

Assistant:

static GLFWbool waitForVisibilityNotify(_GLFWwindow* window)
{
    XEvent dummy;
    double timeout = 0.1;

    while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                   window->x11.handle,
                                   VisibilityNotify,
                                   &dummy))
    {
        if (!waitForX11Event(&timeout))
            return GLFW_FALSE;
    }

    return GLFW_TRUE;
}